

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::AssocArrayExistsMethod::checkArguments
          (AssocArrayExistsMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  Expression *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  Args *in_RDI;
  ASTContext *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_00000020;
  Type *indexType;
  Type *type;
  Compilation *comp;
  Type *pTVar2;
  Type *this_01;
  SystemSubroutine *in_stack_fffffffffffffff8;
  
  this_00 = ASTContext::getCompilation((ASTContext *)0x1332ef9);
  pTVar2 = (Type *)0x1;
  this_01 = (Type *)0x1;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_fffffffffffffff8,in_R8,SUB81((ulong)in_RCX >> 0x38,0),in_RDI,
                     in_stack_00000000,in_stack_00000020,(size_t)indexType);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x1332f7b);
    pTVar2 = Type::getAssociativeIndexType(pTVar2);
    if (pTVar2 == (Type *)0x0) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator->
                ((not_null<const_slang::ast::Type_*> *)0x1332fb2);
      bVar1 = Type::isIntegral(this_01);
      if (!bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        pTVar2 = SystemSubroutine::badArg((SystemSubroutine *)this_00,in_R8,in_RCX);
        return pTVar2;
      }
    }
    pTVar2 = Compilation::getIntType(this_00);
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        auto indexType = type.getAssociativeIndexType();
        if (!indexType && !args[1]->type->isIntegral())
            return badArg(context, *args[1]);

        return comp.getIntType();
    }